

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TwoCaps.cpp
# Opt level: O0

void __thiscall TwoCaps::TwoCaps(TwoCaps *this,double radius)

{
  int iVar1;
  double dVar2;
  double dx_tmp;
  double cap_overlap;
  double radius_local;
  TwoCaps *this_local;
  
  Parameterization::Parameterization(&this->super_Parameterization,radius);
  (this->super_Parameterization)._vptr_Parameterization =
       (_func_int **)&PTR_PrintPlot3DHeader_00108d58;
  std::__cxx11::string::operator=((string *)&(this->super_Parameterization).name,"TwoCaps");
  (this->super_Parameterization).Jmax = 0xa0;
  (this->super_Parameterization).Lmax = 1;
  (this->super_Parameterization).Gmax = 3;
  this->theta1_lb = 0.0;
  this->theta1_ub = 6.283185307179586;
  this->d_theta1 =
       (this->theta1_ub - this->theta1_lb) / ((double)(this->super_Parameterization).Jmax - 1.0);
  this->theta2_lb = 0.6283185307179586;
  this->theta2_ub = 2.5132741228718345;
  (this->super_Parameterization).Kmax =
       (int)((this->theta2_ub - this->theta2_lb) / this->d_theta1) + 1;
  this->d_theta2 =
       (this->theta2_ub - this->theta2_lb) / ((double)(this->super_Parameterization).Kmax - 1.0);
  dVar2 = this->d_theta2 * 2.0;
  this->theta1_cap_lb = -this->theta2_lb - dVar2;
  this->theta1_cap_ub = this->theta2_lb + dVar2;
  this->Jmax_cap = (int)((this->theta1_cap_ub - this->theta1_cap_lb) / this->d_theta1) + 1;
  this->d_theta1_cap = (this->theta1_cap_ub - this->theta1_cap_lb) / (double)(this->Jmax_cap + -1);
  this->theta2_cap_lb = (1.5707963267948966 - this->theta2_lb) - dVar2;
  this->theta2_cap_ub = this->theta2_lb + 1.5707963267948966 + dVar2;
  this->Kmax_cap = (int)((this->theta1_cap_ub - this->theta1_cap_lb) / this->d_theta1) + 1;
  this->d_theta2_cap = (this->theta2_cap_ub - this->theta2_cap_lb) / (double)(this->Kmax_cap + -1);
  (this->super_Parameterization).x_lb = -radius - 0.1;
  (this->super_Parameterization).x_ub = radius + 0.1;
  (this->super_Parameterization).y_lb = -radius - 0.1;
  (this->super_Parameterization).y_ub = radius + 0.1;
  (this->super_Parameterization).z_lb = -radius;
  (this->super_Parameterization).z_ub = radius;
  dVar2 = cos(this->d_theta1);
  dVar2 = sqrt(radius * 2.0 * radius * (1.0 - dVar2));
  iVar1 = (int)(((this->super_Parameterization).x_ub - (this->super_Parameterization).x_lb) / dVar2)
          + 1;
  this->Jmax_cap = iVar1;
  this->Kmax_cap = iVar1;
  (this->super_Parameterization).dx =
       ((this->super_Parameterization).x_ub - (this->super_Parameterization).x_lb) /
       (double)(this->Jmax_cap + -1);
  (this->super_Parameterization).dy =
       ((this->super_Parameterization).y_ub - (this->super_Parameterization).y_lb) /
       (double)(this->Jmax_cap + -1);
  (this->super_Parameterization).dz =
       ((this->super_Parameterization).z_ub - (this->super_Parameterization).z_lb) /
       (double)(this->Jmax_cap + -1);
  return;
}

Assistant:

TwoCaps::TwoCaps(double radius) : Parameterization(radius) {
  name = "TwoCaps";

  Jmax = 160;
  //Kmax = 36;
  Lmax = 1;
  Gmax = 3;

  // Angle in the xy-plane
  theta1_lb = 0.0e0;
  theta1_ub = 2.0e0 * PI;

  d_theta1 = (theta1_ub - theta1_lb) / (double)(Jmax - 1.0e0);

  // Angle between positive z-axis and radius.
  theta2_lb = (1.0e0 / 5.0e0) * PI;
  theta2_ub = (4.0e0 / 5.0e0) * PI;

  Kmax = (int)((theta2_ub - theta2_lb) / d_theta1) + 1;

  d_theta2 = (theta2_ub - theta2_lb) / (double)(Kmax - 1.0e0);

  //-------------------------------------------
  // FOR THE CAPS
  double cap_overlap = 2.0e0 * d_theta2;      // (1.0e0 / 15.0e0) * PI;

  // Angle in the xy-plane
  theta1_cap_lb = -theta2_lb - cap_overlap;
  theta1_cap_ub =  theta2_lb + cap_overlap;

  Jmax_cap = (int)((theta1_cap_ub - theta1_cap_lb) / d_theta1) + 1;

  d_theta1_cap = (theta1_cap_ub - theta1_cap_lb) / (double)(Jmax_cap - 1);

  // Angle between positive z-axis and radius.
  theta2_cap_lb =  PI / 2.0e0 - theta2_lb - cap_overlap;
  theta2_cap_ub =  PI / 2.0e0 + theta2_lb + cap_overlap;

  Kmax_cap = (int)((theta1_cap_ub - theta1_cap_lb) / d_theta1) + 1;

  d_theta2_cap = (theta2_cap_ub - theta2_cap_lb) / (double)(Kmax_cap - 1);

  //-----------------------------------------------------
  x_lb = -radius - 0.1e0;
  x_ub =  radius + 0.1e0;

  y_lb = -radius - 0.1e0;
  y_ub =  radius + 0.1e0;

  z_lb = -radius;   // + 0.01e0;
  z_ub =  radius;   // - 0.01e0;

  double dx_tmp = sqrt(2.0e0 * radius * radius * (1.0e0 - cos(d_theta1)));

  Kmax_cap = Jmax_cap = (int)((x_ub - x_lb) / dx_tmp) + 1;

  dx = (x_ub - x_lb) / (double)(Jmax_cap - 1);
  dy = (y_ub - y_lb) / (double)(Jmax_cap - 1);
  dz = (z_ub - z_lb) / (double)(Jmax_cap - 1);
}